

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O0

int Abc_NtkFastExtract(Abc_Ntk_t *pNtk,Fxu_Data_t *p)

{
  int iVar1;
  Fxu_Data_t *p_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 != 0) {
    Abc_NtkIsSopLogic(pNtk);
    iVar1 = Abc_NtkToSop(pNtk,-1,1000000000);
    if (iVar1 == 0) {
      printf("Abc_NtkFastExtract(): Converting to SOPs has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      iVar1 = Abc_NtkFxuCheck(pNtk);
      if (iVar1 == 0) {
        printf(
              "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.\n"
              );
        pNtk_local._4_4_ = 0;
      }
      else {
        Abc_NtkCleanup(pNtk,0);
        Abc_NtkFxuCollectInfo(pNtk,p);
        iVar1 = Fxu_FastExtract(p);
        if (iVar1 < 1) {
          printf("Warning: The network has not been changed by \"fx\".\n");
          pNtk_local._4_4_ = 0;
        }
        else {
          Abc_NtkFxuReconstruct(pNtk,p);
          iVar1 = Abc_NtkCheck(pNtk);
          if (iVar1 == 0) {
            printf("Abc_NtkFastExtract: The network check has failed.\n");
          }
          pNtk_local._4_4_ = 1;
        }
      }
    }
    return pNtk_local._4_4_;
  }
  __assert_fail("Abc_NtkIsLogic(pNtk)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFxu.c"
                ,0x55,"int Abc_NtkFastExtract(Abc_Ntk_t *, Fxu_Data_t *)");
}

Assistant:

int Abc_NtkFastExtract( Abc_Ntk_t * pNtk, Fxu_Data_t * p )
{
    assert( Abc_NtkIsLogic(pNtk) );
    // if the network is already in the SOP form, it may come from BLIF file
    // and it may not be SCC-free, in which case FXU will not work correctly
    if ( Abc_NtkIsSopLogic(pNtk) )
    { // to make sure the SOPs are SCC-free
//        Abc_NtkSopToBdd(pNtk);
//        Abc_NtkBddToSop(pNtk);
    }
    // get the network in the SOP form
    if ( !Abc_NtkToSop(pNtk, -1, ABC_INFINITY) )
    {
        printf( "Abc_NtkFastExtract(): Converting to SOPs has failed.\n" );
        return 0;
    }
    // check if the network meets the requirements
    if ( !Abc_NtkFxuCheck(pNtk) )
    {
        printf( "Abc_NtkFastExtract: Nodes have duplicated or complemented fanins. FXU is not performed.\n" );
        return 0;
    }
    // sweep removes useless nodes
    Abc_NtkCleanup( pNtk, 0 );
    // collect information about the covers
    Abc_NtkFxuCollectInfo( pNtk, p );
    // call the fast extract procedure
    if ( Fxu_FastExtract(p) > 0 )
    {
        // update the network
        Abc_NtkFxuReconstruct( pNtk, p );
        // make sure everything is okay
        if ( !Abc_NtkCheck( pNtk ) )
            printf( "Abc_NtkFastExtract: The network check has failed.\n" );
        return 1;
    }
    else
        printf( "Warning: The network has not been changed by \"fx\".\n" );
    return 0;
}